

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

Task * AI::create_Null(void)

{
  Task *in_RDI;
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  Task *null;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"null",&local_39);
  Task::Task(in_RDI,&local_38,Simple);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return in_RDI;
}

Assistant:

Task create_Null()
	{
		Task null {"null"};

		return null;
	}